

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O1

int __thiscall libchess::Position::see_for(Position *this,Move move,array<int,_6UL> piece_values)

{
  uint *puVar1;
  ulong uVar2;
  pointer pcVar3;
  array<int,_6UL> piece_values_00;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  Square square;
  ulong uVar10;
  array<int,_6UL> *paVar11;
  Position *pPVar12;
  value_type *pvVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  Position pos;
  undefined1 local_b8 [104];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar9 = (byte)((uint)move.value_ >> 0xf) & 7;
  if (((uint)move.value_ >> 0xf & 7) == 0) {
    uVar4 = move.value_ & 0x3f;
    lVar8 = 0;
    do {
      iVar16 = *(int *)((long)&constants::PIECE_TYPES + lVar8);
      uVar10 = this->piece_type_bb_[iVar16].value_ & 1L << (sbyte)uVar4;
      if (uVar10 != 0) break;
      bVar17 = lVar8 != 0x14;
      lVar8 = lVar8 + 4;
    } while (bVar17);
    uVar7 = (uint)move.value_ >> 6 & 0x3f;
    lVar8 = 0;
    do {
      uVar14 = this->piece_type_bb_[*(int *)((long)&constants::PIECE_TYPES + lVar8)].value_ &
               1L << (sbyte)uVar7;
      if (uVar14 != 0) break;
      bVar17 = lVar8 != 0x14;
      lVar8 = lVar8 + 4;
    } while (bVar17);
    if ((((uint)move.value_ >> 0xc & 7) == 0) || (((uint)move.value_ >> 0xc & 7) == 5)) {
      bVar9 = 6;
      if (uVar14 == 0) {
        if (iVar16 == 0 && uVar10 != 0) {
          iVar15 = uVar7 - uVar4;
          iVar16 = -iVar15;
          if (0 < iVar15) {
            iVar16 = iVar15;
          }
          if ((iVar16 == 7) || (iVar16 == 9)) {
            bVar9 = 3;
          }
          else {
            bVar9 = 5;
            if (iVar16 != 0x10) goto LAB_0011483d;
          }
        }
        else if ((iVar16 != 5 || uVar10 == 0) ||
                (bVar9 = 2, ((uVar7 - uVar4) + 2 & 0xfffffffb) != 0)) {
LAB_0011483d:
          bVar9 = 1;
        }
      }
    }
    else {
      bVar9 = (uVar14 != 0) * '\x03' + 4;
    }
  }
  square.super_MetaValueType<int>.value_ = (MetaValueType<int>)((uint)move.value_ >> 6 & 0x3f);
  uVar10 = 1L << (sbyte)square.super_MetaValueType<int>.value_;
  lVar8 = 0;
  do {
    puVar1 = (uint *)((long)&constants::PIECE_TYPES + lVar8);
    uVar14 = this->piece_type_bb_[(int)*puVar1].value_;
    if ((uVar14 & uVar10) != 0) break;
    bVar17 = lVar8 != 0x14;
    lVar8 = lVar8 + 4;
  } while (bVar17);
  lVar8 = 0;
  do {
    uVar2 = this->color_bb_[*(int *)((long)&constants::COLORS + lVar8)].value_;
    if ((uVar2 & uVar10) != 0) break;
    bVar17 = lVar8 != 4;
    lVar8 = lVar8 + 4;
  } while (bVar17);
  bVar17 = (uVar2 & uVar10) != 0;
  bVar18 = (uVar14 & uVar10) != 0;
  if ((bVar9 == 3) || (iVar16 = 0, bVar18 && bVar17)) {
    paVar11 = &piece_values;
    if (bVar9 != 3) {
      uVar10 = 0;
      if (bVar18 && bVar17) {
        uVar10 = (ulong)(*puVar1 & 7);
      }
      if (5 < uVar10) goto LAB_0011484b;
      paVar11 = (array<int,_6UL> *)((long)piece_values._M_elems + uVar10 * 4);
    }
    iVar15 = paVar11->_M_elems[0];
    uVar4 = (uint)move.value_ >> 0xc & 7;
    if ((((uint)move.value_ >> 0xc & 7) != 0) && (uVar4 != 5)) {
      uVar10 = (ulong)uVar4;
      if (5 < uVar4) {
LAB_0011484b:
        uVar6 = std::__throw_out_of_range_fmt
                          ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar10,6);
        ~Position((Position *)local_b8);
        _Unwind_Resume(uVar6);
      }
      iVar15 = (iVar15 + *(int *)((long)piece_values._M_elems + uVar10 * 4)) -
               piece_values._M_elems[0];
    }
    pPVar12 = this;
    pvVar13 = (value_type *)local_b8;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pvVar13 = pPVar12->piece_type_bb_[0].value_;
      pPVar12 = (Position *)(pPVar12->piece_type_bb_ + 1);
      pvVar13 = pvVar13 + 1;
    }
    local_b8._72_4_ = this->ply_;
    std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::vector
              ((vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *)
               (local_b8 + 0x50),&this->history_);
    pcVar3 = (this->start_fen_)._M_dataplus._M_p;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (this->start_fen_)._M_string_length);
    make_move((Position *)local_b8,move);
    piece_values_00._M_elems[1] = piece_values._M_elems[1];
    piece_values_00._M_elems[0] = piece_values._M_elems[0];
    piece_values_00._M_elems[2] = piece_values._M_elems[2];
    piece_values_00._M_elems[3] = piece_values._M_elems[3];
    piece_values_00._M_elems[4] = piece_values._M_elems[4];
    piece_values_00._M_elems[5] = piece_values._M_elems[5];
    iVar5 = see_to((Position *)local_b8,square,piece_values_00);
    iVar16 = 0;
    if (0 < iVar15 - iVar5) {
      iVar16 = iVar15 - iVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((pointer)local_b8._80_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._80_8_,local_b8._96_8_ - local_b8._80_8_);
    }
  }
  return iVar16;
}

Assistant:

inline int Position::see_for(Move move, std::array<int, 6> piece_values) {
    bool is_enpassant = move_type_of(move) == Move::Type::ENPASSANT;

    auto square_pt = piece_on(move.to_square());
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto move_prom_piece_type = move.promotion_piece_type();
    if (move_prom_piece_type) {
        piece_val += piece_values.at(move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(move);
    return std::max(0, piece_val - pos.see_to(move.to_square(), piece_values));
}